

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_ObjIsDelayCriticalFanin(Acb_Ntk_t *p,int i,int f)

{
  uint uVar1;
  
  if (f < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= f) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  uVar1 = 0;
  if ((p->vObjType).pArray[(uint)f] != '\x03') {
    if (i < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x114,"int Acb_ObjLevelR(Acb_Ntk_t *, int)");
    }
    if (((p->vLevelR).nSize <= i) || ((p->vLevelD).nSize <= f)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar1 = (uint)((p->vLevelD).pArray[(uint)f] + (p->vLevelR).pArray[(uint)i] == p->LevelMax);
  }
  return uVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

static inline int Acb_ObjIsDelayCriticalFanin( Acb_Ntk_t * p, int i, int f )  { return !Acb_ObjIsCi(p, f) && Acb_ObjLevelR(p, i) + Acb_ObjLevelD(p, f) == p->LevelMax; }